

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataVariableNames.cpp
# Opt level: O0

void setMetadataInfo(CallInst *ins,Block *block)

{
  bool bVar1;
  ret_type pMVar2;
  ret_type this;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  this_00;
  pointer ppVar3;
  mapped_type *pmVar4;
  long in_RSI;
  string name;
  iterator it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *counters;
  DILocalVariable *localVar;
  Metadata *varMD;
  Value *variable;
  RefExpr *re;
  Expr *referred;
  Value *referredVal;
  Metadata *md;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  Expr *in_stack_fffffffffffffe90;
  StringRef *in_stack_fffffffffffffec8;
  string local_120 [32];
  string local_100 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_e0;
  StringRef local_d8;
  string local_c8 [8];
  Value *in_stack_ffffffffffffff40;
  Func *in_stack_ffffffffffffff48;
  string local_88 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_68;
  long local_60;
  StringRef local_58;
  ret_type local_48;
  Metadata *local_40;
  ret_type local_38;
  ret_type local_30;
  Expr *local_28;
  Value *local_20;
  Metadata *local_18;
  long local_10;
  
  local_10 = in_RSI;
  llvm::CallBase::getOperand((CallBase *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  pMVar2 = llvm::dyn_cast_or_null<llvm::MetadataAsValue,llvm::Value>
                     ((Value *)in_stack_fffffffffffffe90);
  local_18 = llvm::MetadataAsValue::getMetadata(pMVar2);
  this = llvm::cast<llvm::ValueAsMetadata,llvm::Metadata>((Metadata *)0x28f4db);
  local_20 = llvm::ValueAsMetadata::getValue(this);
  local_28 = Func::getExpr(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  local_30 = llvm::dyn_cast_or_null<RefExpr,Expr>(in_stack_fffffffffffffe90);
  if (local_30 != (ret_type)0x0) {
    local_28 = (local_30->super_UnaryExpr).expr;
  }
  local_38 = llvm::dyn_cast_or_null<Value,Expr>(in_stack_fffffffffffffe90);
  if (local_38 != (ret_type)0x0) {
    llvm::CallBase::getOperand((CallBase *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    pMVar2 = llvm::dyn_cast_or_null<llvm::MetadataAsValue,llvm::Value>
                       ((Value *)in_stack_fffffffffffffe90);
    local_40 = llvm::MetadataAsValue::getMetadata(pMVar2);
    local_48 = llvm::dyn_cast_or_null<llvm::DILocalVariable,llvm::Metadata>
                         ((Metadata *)in_stack_fffffffffffffe90);
    local_58 = llvm::DIVariable::getName((DIVariable *)0x28f5b0);
    bVar1 = llvm::StringRef::empty(&local_58);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_60 = *(long *)(local_10 + 8) + 0xd0;
      llvm::DIVariable::getName((DIVariable *)0x28f60c);
      llvm::StringRef::str_abi_cxx11_(in_stack_fffffffffffffec8);
      this_00._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                  (key_type *)0x28f645);
      local_68._M_cur = this_00._M_cur;
      std::__cxx11::string::~string(local_88);
      local_d8 = llvm::DIVariable::getName((DIVariable *)0x28f673);
      llvm::StringRef::str_abi_cxx11_((StringRef *)this_00._M_cur);
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      bVar1 = std::__detail::operator!=(&local_68,&local_e0);
      if (bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                               *)0x28f6dd);
        ppVar3->second = ppVar3->second + 1;
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                      *)0x28f6f2);
        std::__cxx11::to_string((unsigned_long)this_00._M_cur);
        std::__cxx11::string::operator+=(local_c8,local_100);
        std::__cxx11::string::~string(local_100);
      }
      else {
        llvm::DIVariable::getName((DIVariable *)0x28f7a1);
        llvm::StringRef::str_abi_cxx11_((StringRef *)this_00._M_cur);
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                               *)in_stack_fffffffffffffe90,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        *pmVar4 = 1;
        std::__cxx11::string::~string(local_120);
      }
      std::__cxx11::string::operator=((string *)&local_38->valueName,local_c8);
      std::__cxx11::string::~string(local_c8);
    }
  }
  return;
}

Assistant:

static void setMetadataInfo(const llvm::CallInst* ins, Block* block) {
    llvm::Metadata* md = llvm::dyn_cast_or_null<llvm::MetadataAsValue>(ins->getOperand(0))->getMetadata();
    llvm::Value* referredVal = llvm::cast<llvm::ValueAsMetadata>(md)->getValue();
    Expr* referred = block->func->getExpr(referredVal);

    if (auto* re = llvm::dyn_cast_or_null<RefExpr>(referred)) {
        referred = re->expr;
    }

    if (Value* variable = llvm::dyn_cast_or_null<Value>(referred)) {
        llvm::Metadata* varMD = llvm::dyn_cast_or_null<llvm::MetadataAsValue>(ins->getOperand(1))->getMetadata();
        llvm::DILocalVariable* localVar = llvm::dyn_cast_or_null<llvm::DILocalVariable>(varMD);

        if (!localVar->getName().empty()) {
            auto& counters = block->func->variableCounters;
            auto it = counters.find(localVar->getName().str());
            std::string name = localVar->getName().str();

            if (it != counters.end()) {
                it->second++;
                name += std::to_string(it->second);
            } else {
                counters[localVar->getName().str()] = 1;
            }

            variable->valueName = name;
        }
    }
}